

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  string temp3;
  string temp2;
  string temp4;
  string temp;
  allocator<char> local_109;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"the-stealth-warrior",(allocator<char> *)&local_88);
  to_camel_case(&local_28,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"a_pippi_isOmoshiroi",(allocator<char> *)&local_c8);
  to_camel_case(&local_88,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"theCat_Was_Savage",(allocator<char> *)&local_48);
  to_camel_case(&local_c8,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"the_Cat_Is_Omoshiroi",&local_109);
  to_camel_case(&local_48,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_28);
  return 0;
}

Assistant:

int main()
{
	std::string temp = to_camel_case("the-stealth-warrior");
	std::string temp2 = to_camel_case("a_pippi_isOmoshiroi");
	std::string temp3 = to_camel_case("theCat_Was_Savage");
	std::string temp4 = to_camel_case("the_Cat_Is_Omoshiroi");

	return 0;
}